

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

bool __thiscall
ThreadedReplayer::derived_work_item_is_satisfied<ThreadedReplayer::DeferredGraphicsInfo>
          (ThreadedReplayer *this,DeferredGraphicsInfo *info,
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          *pipelines)

{
  bool bVar1;
  VkPipelineLibraryCreateInfoKHR *library;
  
  if (info->info == (VkGraphicsPipelineCreateInfo *)0x0) {
    bVar1 = false;
  }
  else {
    library = work_item_get_library_info<ThreadedReplayer::DeferredGraphicsInfo>
                        ((ThreadedReplayer *)info,info);
    if (library != (VkPipelineLibraryCreateInfoKHR *)0x0) {
      bVar1 = pipeline_library_info_is_satisfied(this,library,pipelines);
      return bVar1;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool derived_work_item_is_satisfied(const DerivedInfo &info,
	                                    const unordered_map<Hash, VkPipeline> &pipelines) const
	{
		if (!info.info)
			return false;
		auto *library = work_item_get_library_info(info);
		return !library || pipeline_library_info_is_satisfied(*library, pipelines);
	}